

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

Token slang::parsing::Token::createExpected
                (BumpAllocator *alloc,Diagnostics *diagnostics,Token actual,TokenKind expected,
                Token lastConsumed,Token matchingDelim)

{
  size_type sVar1;
  pointer pDVar2;
  SourceLocation SVar3;
  bool bVar4;
  Diagnostic *pDVar5;
  Info *pIVar6;
  DiagCode code;
  SourceLocation *pSVar7;
  SourceLocation SVar8;
  string_view sVar9;
  Token TVar10;
  
  pIVar6 = actual.info;
  if (lastConsumed.info == (Info *)0x0) {
    if (pIVar6 == (Info *)0x0) {
      pSVar7 = (SourceLocation *)&SourceLocation::NoLocation;
    }
    else {
      pSVar7 = &pIVar6->location;
    }
    SVar8 = *pSVar7;
  }
  else {
    SVar8 = (lastConsumed.info)->location;
    sVar9 = rawText(&lastConsumed);
    SVar8 = (SourceLocation)(sVar9._M_len * 0x10000000 + (long)SVar8);
  }
  sVar1 = (diagnostics->super_SmallVector<slang::Diagnostic,_2UL>).
          super_SmallVectorBase<slang::Diagnostic>.len;
  if (sVar1 != 0) {
    pDVar2 = (diagnostics->super_SmallVector<slang::Diagnostic,_2UL>).
             super_SmallVectorBase<slang::Diagnostic>.data_;
    bVar4 = Diagnostic::isError(pDVar2 + (sVar1 - 1));
    if (bVar4) {
      SVar3 = pDVar2[sVar1 - 1].location;
      if (SVar3 == SVar8) goto LAB_0019fe32;
      if (pIVar6 == (Info *)0x0) {
        pSVar7 = (SourceLocation *)&SourceLocation::NoLocation;
      }
      else {
        pSVar7 = &pIVar6->location;
      }
      if (SVar3 == *pSVar7) goto LAB_0019fe32;
    }
  }
  switch(expected) {
  case Identifier:
    code.subsystem = Parser;
    code.code = 0x31;
    break;
  case SystemIdentifier:
  case IntegerBase:
  case UnbasedUnsizedLiteral:
  case RealLiteral:
switchD_0019fd8d_caseD_3:
    pDVar5 = Diagnostics::add(diagnostics,(DiagCode)0x460005,SVar8);
    sVar9 = LexerFacts::getTokenKindText(expected);
    Diagnostic::operator<<(pDVar5,sVar9);
    if (matchingDelim.info != (Info *)0x0) {
      pDVar5 = Diagnostic::addNote(pDVar5,(DiagCode)0x900005,(matchingDelim.info)->location);
      sVar9 = LexerFacts::getTokenKindText(matchingDelim.kind);
      Diagnostic::operator<<(pDVar5,sVar9);
    }
    goto LAB_0019fe32;
  case StringLiteral:
    code.subsystem = Parser;
    code.code = 0x44;
    break;
  case IntegerLiteral:
    code.subsystem = Parser;
    code.code = 0x33;
    break;
  case TimeLiteral:
    code.subsystem = Preprocessor;
    code.code = 10;
    break;
  default:
    if (expected != IncludeFileName) goto switchD_0019fd8d_caseD_3;
    code.subsystem = Preprocessor;
    code.code = 4;
  }
  Diagnostics::add(diagnostics,code,SVar8);
LAB_0019fe32:
  TVar10 = createMissing(alloc,expected,SVar8);
  return TVar10;
}

Assistant:

Token Token::createExpected(BumpAllocator& alloc, Diagnostics& diagnostics, Token actual,
                            TokenKind expected, Token lastConsumed, Token matchingDelim) {
    // Figure out the best place to report this error based on the current
    // token as well as the last real token we consumed.
    SourceLocation location;
    if (!lastConsumed)
        location = actual.location();
    else {
        location = lastConsumed.location();
        location = location + lastConsumed.rawText().length();
    }

    // If there is already a diagnostic issued for this location, don't report this
    // one as well since it will just lead to lots of spam and the first error is
    // probably the thing that actually caused the issue.
    bool report = true;
    if (!diagnostics.empty()) {
        const Diagnostic& diag = diagnostics.back();
        if (diag.isError() && (diag.location == location || diag.location == actual.location()))
            report = false;
    }

    if (report) {
        switch (expected) {
            case TokenKind::Identifier:
                diagnostics.add(diag::ExpectedIdentifier, location);
                break;
            case TokenKind::StringLiteral:
                diagnostics.add(diag::ExpectedStringLiteral, location);
                break;
            case TokenKind::IntegerLiteral:
                diagnostics.add(diag::ExpectedIntegerLiteral, location);
                break;
            case TokenKind::TimeLiteral:
                diagnostics.add(diag::ExpectedTimeLiteral, location);
                break;
            case TokenKind::IncludeFileName:
                diagnostics.add(diag::ExpectedIncludeFileName, location);
                break;
            default: {
                auto& diag = diagnostics.add(diag::ExpectedToken, location);
                diag << LexerFacts::getTokenKindText(expected);
                if (matchingDelim) {
                    diag.addNote(diag::NoteToMatchThis, matchingDelim.location())
                        << LexerFacts::getTokenKindText(matchingDelim.kind);
                }
                break;
            }
        }
    }
    return Token::createMissing(alloc, expected, location);
}